

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O2

int wally_ec_sig_verify(uchar *pub_key,size_t pub_key_len,uchar *bytes,size_t bytes_len,
                       uint32_t flags,uchar *sig,size_t sig_len)

{
  int iVar1;
  int iVar2;
  secp256k1_context_struct *ctx;
  secp256k1_ecdsa_signature sig_secp;
  secp256k1_pubkey pub;
  
  ctx = secp_ctx();
  iVar2 = -2;
  if ((((bytes_len == 0x20 && pub_key_len == 0x21) &&
        (bytes != (uchar *)0x0 && pub_key != (uchar *)0x0)) && ((flags & 3) - 1 < 2)) &&
     (sig_len == 0x40 && (sig != (uchar *)0x0 && flags < 4))) {
    if (ctx == (secp256k1_context_struct *)0x0) {
      iVar2 = -3;
    }
    else {
      iVar1 = pubkey_parse(&pub,pub_key,0x21);
      iVar2 = -2;
      if ((flags < 2) && (iVar1 != 0)) {
        iVar1 = secp256k1_ecdsa_signature_parse_compact(ctx,&sig_secp,sig);
        if (iVar1 != 0) {
          iVar2 = secp256k1_ecdsa_verify(ctx,&sig_secp,bytes,&pub);
          iVar2 = (uint)(iVar2 != 0) * 2 + -2;
        }
      }
      wally_clear_2(&pub,0x40,&sig_secp,0x40);
    }
  }
  return iVar2;
}

Assistant:

int wally_ec_sig_verify(const unsigned char *pub_key, size_t pub_key_len,
                        const unsigned char *bytes, size_t bytes_len,
                        uint32_t flags,
                        const unsigned char *sig, size_t sig_len)
{
    secp256k1_pubkey pub;
    secp256k1_ecdsa_signature sig_secp;
    const secp256k1_context *ctx = secp_ctx();
    bool ok;

    if (!pub_key || pub_key_len != EC_PUBLIC_KEY_LEN ||
        !bytes || bytes_len != EC_MESSAGE_HASH_LEN ||
        !is_valid_ec_type(flags) || flags & ~EC_FLAGS_TYPES ||
        !sig || sig_len != EC_SIGNATURE_LEN)
        return WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    ok = pubkey_parse(&pub, pub_key, pub_key_len);

    if (flags & EC_FLAG_SCHNORR)
#if 0 /*FIXME: Schnorr is unavailable in secp for now*/
        ok = ok && secp256k1_schnorr_verify(ctx, sig, bytes, &pub);
#else
        ok = false;
#endif
    else
        ok = ok && secp256k1_ecdsa_signature_parse_compact(ctx, &sig_secp, sig) &&
             secp256k1_ecdsa_verify(ctx, &sig_secp, bytes, &pub);

    wally_clear_2(&pub, sizeof(pub), &sig_secp, sizeof(sig_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}